

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_EditionDefaultsInvalidMinimumTwice_Test::TestBody
          (CommandLineInterfaceTest_EditionDefaultsInvalidMinimumTwice_Test *this)

{
  Descriptor *this_00;
  FileDescriptor *this_01;
  string_view local_98;
  allocator<char> local_81;
  string local_80;
  string local_50;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_EditionDefaultsInvalidMinimumTwice_Test *local_10;
  CommandLineInterfaceTest_EditionDefaultsInvalidMinimumTwice_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,"google/protobuf/descriptor.proto");
  this_00 = DescriptorProto::descriptor();
  this_01 = Descriptor::file(this_00);
  FileDescriptor::DebugString_abi_cxx11_(&local_50,this_01);
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "protocol_compiler --proto_path=$tmpdir --edition_defaults_minimum=2023 --edition_defaults_minimum=2023 google/protobuf/descriptor.proto"
             ,&local_81);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_98,"edition_defaults_minimum may only be passed once");
  CommandLineInterfaceTester::ExpectErrorSubstring((CommandLineInterfaceTester *)this,local_98);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, EditionDefaultsInvalidMinimumTwice) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  Run("protocol_compiler --proto_path=$tmpdir "
      "--edition_defaults_minimum=2023 "
      "--edition_defaults_minimum=2023 "
      "google/protobuf/descriptor.proto");
  ExpectErrorSubstring("edition_defaults_minimum may only be passed once");
}